

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_variantSelectionMap
                   (string *__return_storage_ptr__,VariantSelectionMap *m,uint32_t indent)

{
  ostream *poVar1;
  uint32_t n;
  undefined8 extraout_RDX;
  _Rb_tree_node_base *p_Var2;
  undefined1 auVar3 [16];
  stringstream ss;
  allocator local_22d;
  uint local_22c;
  pprint *local_228;
  string *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((m->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_220 = __return_storage_ptr__;
    pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)indent,n);
    poVar1 = std::operator<<(local_1a8,(string *)&local_218);
    std::operator<<(poVar1,"variants = {\n");
    std::__cxx11::string::_M_dispose();
    auVar3._8_8_ = extraout_RDX;
    auVar3._0_8_ = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_22c = indent + 1;
    local_228 = (pprint *)(ulong)indent;
    while (p_Var2 = auVar3._0_8_,
          (_Rb_tree_header *)p_Var2 != &(m->_M_t)._M_impl.super__Rb_tree_header) {
      pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_22c,auVar3._8_4_);
      poVar1 = std::operator<<(local_1a8,(string *)&local_218);
      poVar1 = std::operator<<(poVar1,"string ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
      poVar1 = std::operator<<(poVar1," = ");
      std::__cxx11::string::string((string *)&local_1f8,"\"",&local_22d);
      quote(&local_1d8,(string *)(p_Var2 + 2),&local_1f8);
      poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      auVar3 = std::_Rb_tree_increment(p_Var2);
    }
    pprint::Indent_abi_cxx11_(&local_218,local_228,auVar3._8_4_);
    poVar1 = std::operator<<(local_1a8,(string *)&local_218);
    std::operator<<(poVar1,"}\n");
    std::__cxx11::string::_M_dispose();
    __return_storage_ptr__ = local_220;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_variantSelectionMap(const VariantSelectionMap &m,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (m.empty()) {
    return ss.str();
  }

  ss << pprint::Indent(indent) << "variants = {\n";
  for (const auto &item : m) {
    ss << pprint::Indent(indent + 1) << "string " << item.first << " = "
       << quote(item.second) << "\n";
  }
  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}